

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONParser.cpp
# Opt level: O3

Var __thiscall JSON::JSONParser::ParseObject(JSONParser *this)

{
  ushort uVar1;
  charcount_t len;
  PropertyId propertyId;
  char16_t *string;
  JsonTypeCacheList *this_00;
  PropertyRecord *pPVar2;
  DynamicType *pDVar3;
  DynamicTypeHandler *newTypeHandler;
  double dVar4;
  PropertyIndex PVar5;
  bool bVar6;
  uint uVar7;
  tokens tVar8;
  int iVar9;
  BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  JavascriptArray *pJVar10;
  RecyclableObject *obj;
  Var pvVar11;
  JSONScanner *pJVar12;
  ulong uVar13;
  undefined1 local_98 [8];
  PropertyValueInfo info;
  JsonTypeCache *local_50;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  JsonTypeCache *local_38;
  JsonTypeCache *currentCache;
  
  ThreadContext::ProbeStack(this->scriptContext->threadContext,0xc00,this->scriptContext,(PVOID)0x0)
  ;
  tVar8 = (this->m_token).tk;
  if ((int)tVar8 < 0x77) {
    if ((int)tVar8 < 0x32) {
      if (tVar8 == tkFALSE) {
        pJVar10 = (JavascriptArray *)
                  (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).booleanFalse.ptr;
      }
      else {
        if (tVar8 != tkNULL) goto LAB_00b610b5;
        pJVar10 = (JavascriptArray *)
                  (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).nullValue.ptr;
      }
    }
    else {
      if (tVar8 != tkTRUE) {
        if (tVar8 != tkLCurly) goto LAB_00b610b5;
        if ((this->arenaAllocator != (ArenaAllocator *)0x0) &&
           (this->typeCacheList == (JsonTypeCacheList *)0x0)) {
          this_01 = (BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)new<Memory::ArenaAllocator>(0x38,this->arenaAllocator,0x364470);
          JsUtil::
          BaseDictionary<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::BaseDictionary(this_01,this->arenaAllocator,8);
          this->typeCacheList = this_01;
        }
        pJVar10 = (JavascriptArray *)
                  Js::JavascriptLibrary::CreateObject
                            ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,false,
                             0);
        bVar6 = Js::ConfigFlagsTable::IsEnabled
                          ((ConfigFlagsTable *)&Js::Configuration::Global,autoProxyFlag);
        if (bVar6) {
          obj = Js::JavascriptProxy::AutoProxyWrapper(pJVar10);
          pJVar10 = (JavascriptArray *)Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
        }
        pJVar12 = &this->m_scanner;
        JSONScanner::Scan(pJVar12);
        tVar8 = (this->m_token).tk;
        if (tVar8 != tkRCurly) {
          local_38 = (JsonTypeCache *)0x0;
          if (tVar8 == tkStrCon) {
            local_50 = (JsonTypeCache *)0x0;
            propertyRecord = (PropertyRecord *)pJVar12;
            do {
              string = (this->m_scanner).currentString;
              len = (this->m_scanner).currentIndex;
              info._56_8_ = (pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                            type.ptr;
              if (this->arenaAllocator == (ArenaAllocator *)0x0) {
LAB_00b60dba:
                Js::ScriptContext::GetOrAddPropertyRecord(this->scriptContext,string,len,&local_48);
                tVar8 = JSONScanner::Scan(pJVar12);
                if (tVar8 != tkColon) {
LAB_00b6109b:
                  JSONScanner::ThrowSyntaxError(pJVar12,-0x7ff5e9ed);
                }
                JSONScanner::Scan(pJVar12);
                pvVar11 = ParseObject(this);
                local_98 = (undefined1  [8])0x0;
                info.m_instance = (RecyclableObject *)0x50000ffff;
                info.prop = (RecyclableObject *)0x0;
                info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
                info.functionBody = (FunctionBody *)0x0;
                info.m_propertyIndex = 0;
                info.m_attributes = '\0';
                info.flags = InlineCacheNoFlags;
                info.cacheInfoFlag = 0;
                info.inlineCache = (InlineCache *)0x0;
                info.propertyRecordUsageCache._0_4_ = 0xffffffff;
                info.propertyRecordUsageCache._5_1_ = 1;
                (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x17])(pJVar10,(ulong)(uint)local_48->pid,pvVar11,0,local_98);
                if ((((this->arenaAllocator != (ArenaAllocator *)0x0) &&
                     (local_48->isNumeric == false)) &&
                    ((pDVar3 = (DynamicType *)
                               (pJVar10->super_ArrayObject).super_DynamicObject.
                               super_RecyclableObject.type.ptr,
                     pJVar12 = (JSONScanner *)propertyRecord, local_98 == (undefined1  [8])0x0 ||
                     ((PropertyIndex)info.m_instance != -1)))) &&
                   ((pDVar3->isShared == true &&
                    (iVar9 = (*((pDVar3->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])(),
                    pPVar2 = local_48, pJVar12 = (JSONScanner *)propertyRecord, iVar9 != 0)))) {
                  PVar5 = (PropertyIndex)info.m_instance;
                  if (local_50 == (JsonTypeCache *)0x0) {
                    local_38 = (JsonTypeCache *)
                               new<Memory::ArenaAllocator>(0x28,this->arenaAllocator,0x364470);
                    local_38->propertyRecord = pPVar2;
                    local_38->typeWithoutProperty = (DynamicType *)info._56_8_;
                    local_38->typeWithProperty = pDVar3;
                    local_38->next = (JsonTypeCache *)0x0;
                    local_38->propertyIndex = PVar5;
                    JsUtil::
                    BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    ::
                    Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                              ((BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                *)this->typeCacheList,&local_48,&local_38);
                  }
                  else if (local_38 == (JsonTypeCache *)0x0) {
                    local_38 = (JsonTypeCache *)
                               new<Memory::ArenaAllocator>(0x28,this->arenaAllocator,0x364470);
                    local_38->propertyRecord = pPVar2;
                    local_38->typeWithoutProperty = (DynamicType *)info._56_8_;
                    local_38->typeWithProperty = pDVar3;
                    local_38->next = (JsonTypeCache *)0x0;
                    local_38->propertyIndex = PVar5;
                    local_50->next = local_38;
                  }
                  else {
                    local_38->propertyRecord = local_48;
                    local_38->typeWithoutProperty = (DynamicType *)info._56_8_;
                    local_38->typeWithProperty = pDVar3;
                    local_38->propertyIndex = (PropertyIndex)info.m_instance;
                  }
                  local_50 = local_38;
                  local_38 = local_38->next;
                  pJVar12 = (JSONScanner *)propertyRecord;
                }
              }
              else {
                if (local_50 == (JsonTypeCache *)0x0) {
                  this_00 = this->typeCacheList;
                  Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
                            ((HashedCharacterBuffer<char16_t> *)local_98,string,len);
                  uVar7 = JsUtil::
                          BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          ::FindEntryWithKey<Js::HashedCharacterBuffer<char16_t>>
                                    ((BaseDictionary<Js::PropertyRecord_const*,JSON::JsonTypeCache*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                      *)this_00,(HashedCharacterBuffer<char16_t> *)local_98);
                  pJVar12 = (JSONScanner *)propertyRecord;
                  if ((int)uVar7 < 0) {
                    local_38 = (JsonTypeCache *)0x0;
                  }
                  else {
                    local_38 = this_00->entries[uVar7].
                               super_DefaultHashedEntry<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                               .
                               super_KeyValueEntry<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*>
                               .
                               super_ValueEntry<JSON::JsonTypeCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*>_>
                               .
                               super_KeyValueEntryDataLayout2<const_Js::PropertyRecord_*,_JSON::JsonTypeCache_*>
                               .value;
                  }
                }
                if ((local_38 == (JsonTypeCache *)0x0) ||
                   (local_38->typeWithoutProperty != (DynamicType *)info._56_8_)) goto LAB_00b60dba;
                pPVar2 = local_38->propertyRecord;
                Memory::Recycler::WBSetBit(local_98);
                local_98 = (undefined1  [8])string;
                Memory::RecyclerWriteBarrierManager::WriteBarrier(local_98);
                pJVar12 = (JSONScanner *)propertyRecord;
                info.m_instance = (RecyclableObject *)CONCAT44(info.m_instance._4_4_,len);
                bVar6 = Js::PropertyRecord::Equals(pPVar2,(CharacterBuffer<char16_t> *)local_98);
                if (!bVar6) goto LAB_00b60dba;
                tVar8 = JSONScanner::Scan(pJVar12);
                if (tVar8 != tkColon) goto LAB_00b6109b;
                JSONScanner::Scan(pJVar12);
                pDVar3 = local_38->typeWithProperty;
                propertyId = local_38->propertyRecord->pid;
                uVar1 = local_38->propertyIndex;
                local_50 = local_38;
                local_38 = local_38->next;
                newTypeHandler = (pDVar3->typeHandler).ptr;
                Js::DynamicObject::EnsureSlots
                          ((DynamicObject *)pJVar10,*(int *)(*(long *)(info._56_8_ + 0x28) + 0xc),
                           newTypeHandler->slotCapacity,this->scriptContext,newTypeHandler);
                pJVar12 = (JSONScanner *)propertyRecord;
                Js::DynamicObject::ReplaceType((DynamicObject *)pJVar10,pDVar3);
                pvVar11 = ParseObject(this);
                Js::DynamicObject::SetSlot
                          ((DynamicObject *)pJVar10,propertyId,false,(uint)uVar1,pvVar11);
              }
              tVar8 = (this->m_token).tk;
              if (tVar8 != tkComma) {
                if (tVar8 != tkRCurly) {
                  JSONScanner::ThrowSyntaxError(pJVar12,-0x7ff5e9eb);
                }
                goto LAB_00b61084;
              }
              JSONScanner::Scan(pJVar12);
            } while ((this->m_token).tk == tkStrCon);
          }
          goto LAB_00b60fa4;
        }
        goto LAB_00b61084;
      }
      pJVar10 = (JavascriptArray *)
                (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).booleanTrue.ptr;
    }
  }
  else {
    if ((int)tVar8 < 0x8c) {
      if (tVar8 != tkSub) {
        if (tVar8 == tkLBrack) {
          uVar13 = 0;
          pJVar10 = Js::JavascriptLibrary::CreateArray
                              ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,0);
          pJVar12 = &this->m_scanner;
          JSONScanner::Scan(pJVar12);
          bVar6 = (this->m_token).tk == tkRBrack;
          do {
            if (bVar6) goto LAB_00b61084;
            pvVar11 = ParseObject(this);
            (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x29])(pJVar10,uVar13,pvVar11,0);
            tVar8 = (this->m_token).tk;
            if (tVar8 != tkComma) {
              if (tVar8 != tkRBrack) {
                JSONScanner::ThrowSyntaxError(pJVar12,-0x7ff5e9ec);
              }
              goto LAB_00b61084;
            }
            uVar13 = (ulong)((int)uVar13 + 1);
            JSONScanner::Scan(pJVar12);
            bVar6 = false;
          } while ((this->m_token).tk != tkRBrack);
LAB_00b60fa4:
          JSONScanner::ThrowSyntaxError(pJVar12,-0x7ff5e9e9);
        }
LAB_00b610b5:
        JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9ee);
      }
      tVar8 = JSONScanner::Scan(&this->m_scanner);
      if (tVar8 != tkFltCon) {
        JSONScanner::ThrowSyntaxError(&this->m_scanner,-0x7ff5e9ea);
      }
      dVar4 = Token::GetDouble((Token *)this);
      pJVar10 = (JavascriptArray *)Js::JavascriptNumber::ToVarIntCheck(-dVar4,this->scriptContext);
LAB_00b6105a:
      JSONScanner::Scan(&this->m_scanner);
      return pJVar10;
    }
    if (tVar8 == tkStrCon) {
      pJVar10 = (JavascriptArray *)
                Js::JavascriptString::NewCopyBuffer
                          ((this->m_scanner).currentString,(this->m_scanner).currentIndex,
                           this->scriptContext);
      goto LAB_00b6105a;
    }
    if (tVar8 != tkFltCon) goto LAB_00b610b5;
    dVar4 = Token::GetDouble((Token *)this);
    pJVar10 = (JavascriptArray *)Js::JavascriptNumber::ToVarIntCheck(dVar4,this->scriptContext);
  }
  pJVar12 = &this->m_scanner;
LAB_00b61084:
  JSONScanner::Scan(pJVar12);
  return pJVar10;
}

Assistant:

Js::Var JSONParser::ParseObject()
    {
        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);

        Js::Var retVal;

        switch (m_token.tk)
        {

        case tkFltCon:
            retVal = Js::JavascriptNumber::ToVarIntCheck(m_token.GetDouble(), scriptContext);
            Scan();
            return retVal;

        case tkStrCon:
            {
                // will auto-null-terminate the string (as length=len+1)
                uint len = m_scanner.GetCurrentStringLen();
                retVal = Js::JavascriptString::NewCopyBuffer(m_scanner.GetCurrentString(), len, scriptContext);
                Scan();
                return retVal;
            }

        case tkTRUE:
            retVal = scriptContext->GetLibrary()->GetTrue();
            Scan();
            return retVal;

        case tkFALSE:
            retVal = scriptContext->GetLibrary()->GetFalse();
            Scan();
            return retVal;

        case tkNULL:
            retVal = scriptContext->GetLibrary()->GetNull();
            Scan();
            return retVal;

        case tkSub:  // unary minus

            if (Scan() == tkFltCon)
            {
                retVal = Js::JavascriptNumber::ToVarIntCheck(-m_token.GetDouble(), scriptContext);
                Scan();
                return retVal;
            }
            else
            {
                m_scanner.ThrowSyntaxError(JSERR_JsonBadNumber);
            }

        case tkLBrack:
            {

                Js::JavascriptArray* arrayObj = scriptContext->GetLibrary()->CreateArray(0);

                //skip '['
                Scan();

                //iterate over the array members, get JSON objects and add them in the pArrayMemberList
                uint k = 0;
                while (true)
                {
                    if(tkRBrack == m_token.tk)
                    {
                        break;
                    }
                    Js::Var value = ParseObject();
                    arrayObj->SetItem(k++, value, Js::PropertyOperation_None);

                    // if next token is not a comma consider the end of the array member list.
                    if (tkComma != m_token.tk)
                        break;
                    Scan();
                    if(tkRBrack == m_token.tk)
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonIllegalChar);
                    }
                }
                //check and consume the ending ']'
                CheckCurrentToken(tkRBrack, JSERR_JsonNoRbrack);
                return arrayObj;

            }

        case tkLCurly:
            {

                // Parse an object, "{"name1" : ObjMember1, "name2" : ObjMember2, ...} "
                if(IsCaching())
                {
                    if(!typeCacheList)
                    {
                        typeCacheList = Anew(this->arenaAllocator, JsonTypeCacheList, this->arenaAllocator, 8);
                    }
                }

                // first, create the object
                Js::DynamicObject* object = scriptContext->GetLibrary()->CreateObject();
                JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
                {
                    object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
                }
#endif

                //next token after '{'
                Scan();

                //if empty object "{}" return;
                if(tkRCurly == m_token.tk)
                {
                    Scan();
                    return object;
                }
                JsonTypeCache* previousCache = nullptr;
                JsonTypeCache* currentCache = nullptr;
                //parse the list of members
                while(true)
                {
                    // parse a list member:  "name" : ObjMember
                    // and add it to the object.

                    //pick "name"
                    if(tkStrCon != m_token.tk)
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonIllegalChar);
                    }

                    // currentStrLength = length w/o null-termination
                    WCHAR* currentStr = m_scanner.GetCurrentString();
                    uint currentStrLength = m_scanner.GetCurrentStringLen();

                    DynamicType* typeWithoutProperty = object->GetDynamicType();
                    if(IsCaching())
                    {
                        if(!previousCache)
                        {
                            // This is the first property in the list - see if we have an existing cache for it.
                            currentCache = typeCacheList->LookupWithKey(Js::HashedCharacterBuffer<WCHAR>(currentStr, currentStrLength), nullptr);
                        }
                        if(currentCache && currentCache->typeWithoutProperty == typeWithoutProperty &&
                            currentCache->propertyRecord->Equals(JsUtil::CharacterBuffer<WCHAR>(currentStr, currentStrLength)))
                        {
                            //check and consume ":"
                            if(Scan() != tkColon )
                            {
                                m_scanner.ThrowSyntaxError(JSERR_JsonNoColon);
                            }
                            Scan();

                            // Cache all values from currentCache as there is a chance that ParseObject might change the cache
                            DynamicType* typeWithProperty = currentCache->typeWithProperty;
                            PropertyId propertyId = currentCache->propertyRecord->GetPropertyId();
                            PropertyIndex propertyIndex = currentCache->propertyIndex;
                            previousCache = currentCache;
                            currentCache = currentCache->next;

                            // fast path for type transition and property set
                            object->EnsureSlots(typeWithoutProperty->GetTypeHandler()->GetSlotCapacity(),
                                typeWithProperty->GetTypeHandler()->GetSlotCapacity(), scriptContext, typeWithProperty->GetTypeHandler());
                            object->ReplaceType(typeWithProperty);
                            Js::Var value = ParseObject();
                            object->SetSlot(SetSlotArguments(propertyId, propertyIndex, value));

                            // if the next token is not a comma consider the list of members done.
                            if (tkComma != m_token.tk)
                                break;
                            Scan();
                            continue;
                        }
                    }

                    // slow path
                    Js::PropertyRecord const * propertyRecord;
                    scriptContext->GetOrAddPropertyRecord(currentStr, currentStrLength, &propertyRecord);

                    //check and consume ":"
                    if(Scan() != tkColon )
                    {
                        m_scanner.ThrowSyntaxError(JSERR_JsonNoColon);
                    }
                    Scan();
                    Js::Var value = ParseObject();
                    PropertyValueInfo info;
                    object->SetProperty(propertyRecord->GetPropertyId(), value, PropertyOperation_None, &info);

                    DynamicType* typeWithProperty = object->GetDynamicType();
                    if(IsCaching() && !propertyRecord->IsNumeric() && !info.IsNoCache() && typeWithProperty->GetIsShared() && typeWithProperty->GetTypeHandler()->IsPathTypeHandler())
                    {
                        PropertyIndex propertyIndex = info.GetPropertyIndex();

                        if(!previousCache)
                        {
                            // This is the first property in the set add it to the dictionary.
                            currentCache = JsonTypeCache::New(this->arenaAllocator, propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                            typeCacheList->AddNew(propertyRecord, currentCache);
                        }
                        else if(!currentCache)
                        {
                            currentCache = JsonTypeCache::New(this->arenaAllocator, propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                            previousCache->next = currentCache;
                        }
                        else
                        {
                            // cache miss!!
                            currentCache->Update(propertyRecord, typeWithoutProperty, typeWithProperty, propertyIndex);
                        }
                        previousCache = currentCache;
                        currentCache = currentCache->next;
                    }

                    // if the next token is not a comma consider the list of members done.
                    if (tkComma != m_token.tk)
                        break;
                    Scan();
                }

                // check  and consume the ending '}"
                CheckCurrentToken(tkRCurly, JSERR_JsonNoRcurly);
                return object;
            }

        default:
            m_scanner.ThrowSyntaxError(JSERR_JsonSyntax);
        }
    }